

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZlibWriter.cpp
# Opt level: O0

ssize_t __thiscall ZlibWriter::write(ZlibWriter *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  ulong uVar2;
  size_type sVar3;
  undefined4 in_register_00000034;
  ulong local_4048;
  size_t i;
  size_t bytes_written;
  uint8_t zchunk [16384];
  int zresult;
  size_t size_local;
  void *buf_local;
  ZlibWriter *this_local;
  
  this->zbuf_changed = true;
  (this->z).next_in = (Bytef *)CONCAT44(in_register_00000034,__fd);
  this_local._4_4_ = (uint)__buf;
  (this->z).avail_in = this_local._4_4_;
  do {
    (this->z).next_out = (Bytef *)&bytes_written;
    (this->z).avail_out = 0x4000;
    iVar1 = deflate(&this->z,0);
    if ((iVar1 != 0) && (iVar1 != 1)) {
      this_local._4_4_ = this_local._4_4_ - (this->z).avail_in;
      break;
    }
    uVar2 = (ulong)(0x4000 - (this->z).avail_out);
    if (uVar2 != 0) {
      sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->zbuf);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(&this->zbuf,sVar3 + uVar2)
      ;
      for (local_4048 = 0; local_4048 < uVar2; local_4048 = local_4048 + 1) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  (&this->zbuf,zchunk + (local_4048 - 8));
      }
    }
  } while ((this->z).avail_in != 0);
  return (ulong)this_local._4_4_;
}

Assistant:

int ZlibWriter::write(const void * buf, size_t size)
{
	int zresult;
	uint8_t zchunk[ZLIB_CHUNK_SIZE];

	zbuf_changed = true;

	z.next_in = (Bytef *) buf;
	z.avail_in = (uInt) size;
	do
	{
		z.next_out = zchunk;
		z.avail_out = ZLIB_CHUNK_SIZE;

		zresult = deflate(&z, Z_NO_FLUSH);
		if (zresult != Z_OK && zresult != Z_STREAM_END)
		{
			return (int) (size - z.avail_in);
		}

		size_t bytes_written = ZLIB_CHUNK_SIZE - z.avail_out;
		if (bytes_written != 0)
		{
			zbuf.reserve(zbuf.size() + bytes_written);
			for (size_t i = 0; i < bytes_written; i++)
			{
				zbuf.push_back(zchunk[i]);
			}
		}
	} while (z.avail_in != 0);

	return (int) size;
}